

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O0

void gravity_fiber_reassign(gravity_fiber_t *fiber,gravity_closure_t *closure,uint16_t nargs)

{
  gravity_callframe_t *pgVar1;
  uint local_34;
  uint32_t *local_30;
  gravity_callframe_t *frame;
  uint16_t nargs_local;
  gravity_closure_t *closure_local;
  gravity_fiber_t *fiber_local;
  
  pgVar1 = fiber->frames;
  pgVar1->closure = closure;
  if (closure->f->tag == EXEC_TYPE_NATIVE) {
    local_30 = (closure->f->field_9).field_0.bytecode;
  }
  else {
    local_30 = (uint32_t *)0x0;
  }
  pgVar1->ip = local_30;
  pgVar1->dest = 0;
  pgVar1->stackstart = fiber->stack;
  fiber->nframes = 1;
  fiber->upvalues = (gravity_upvalue_t *)0x0;
  if (nargs < closure->f->nparams) {
    local_34 = (uint)closure->f->nparams;
  }
  else {
    local_34 = (uint)nargs;
  }
  fiber->stacktop =
       fiber->stacktop + (int)(local_34 + closure->f->nlocals + (uint)closure->f->ntemps);
  return;
}

Assistant:

void gravity_fiber_reassign (gravity_fiber_t *fiber, gravity_closure_t *closure, uint16_t nargs) {
    gravity_callframe_t *frame = &fiber->frames[0];
    frame->closure = closure;
    frame->ip = (closure->f->tag == EXEC_TYPE_NATIVE) ? closure->f->bytecode : NULL;

    frame->dest = 0;
    frame->stackstart = fiber->stack;

    fiber->nframes = 1;
    fiber->upvalues = NULL;

    // update stacktop in order to be GC friendly
    fiber->stacktop += FN_COUNTREG(closure->f, nargs);
}